

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void SimpleLoggerMgr::handleSegFault(int sig)

{
  bool bVar1;
  SimpleLoggerMgr *this;
  allocator local_39;
  string local_38;
  
  this = get();
  signal(0xb,(__sighandler_t)this->oldSigSegvHandler);
  enableOnlyOneDisplayer(this);
  std::__cxx11::string::string((string *)&local_38,"Segmentation fault",&local_39);
  flushAllLoggers(this,1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  logStackBacktrace(this,60000);
  puts("[SEG FAULT] Flushed all logs safely.");
  fflush(_stdout);
  bVar1 = chkExitOnCrash(this);
  if (!bVar1) {
    if (this->oldSigSegvHandler != (_func_void_int *)0x0) {
      (*this->oldSigSegvHandler)(sig);
    }
    return;
  }
  puts("[SEG FAULT] Exit on crash.");
  fflush(_stdout);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::handleSegFault(int sig) {
#if defined(__linux__) || defined(__APPLE__)
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    signal(SIGSEGV, mgr->oldSigSegvHandler);
    mgr->enableOnlyOneDisplayer();
    mgr->flushAllLoggers(1, "Segmentation fault");
    mgr->logStackBacktrace();

    printf("[SEG FAULT] Flushed all logs safely.\n");
    fflush(stdout);

    if (mgr->chkExitOnCrash()) {
        printf("[SEG FAULT] Exit on crash.\n");
        fflush(stdout);
        exit(-1);
    }

    if (mgr->oldSigSegvHandler) {
        mgr->oldSigSegvHandler(sig);
    }
#endif
}